

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bstrcmp(const_bstring b0,const_bstring b1)

{
  int iVar1;
  int local_2c;
  int n;
  int v;
  int i;
  const_bstring b1_local;
  const_bstring b0_local;
  
  if (((((b0 == (const_bstring)0x0) || (b1 == (const_bstring)0x0)) || (b0->data == (uchar *)0x0)) ||
      ((b1->data == (uchar *)0x0 || (b0->slen < 0)))) || (b1->slen < 0)) {
    b0_local._4_4_ = -0x8000;
  }
  else {
    local_2c = b0->slen;
    if (b1->slen < local_2c) {
      local_2c = b1->slen;
    }
    if ((b0->slen == b1->slen) && ((b0->data == b1->data || (b0->slen == 0)))) {
      b0_local._4_4_ = 0;
    }
    else {
      for (n = 0; n < local_2c; n = n + 1) {
        iVar1 = (int)(char)b0->data[n] - (int)(char)b1->data[n];
        if (iVar1 != 0) {
          return iVar1;
        }
        if (b0->data[n] == '\0') {
          return 0;
        }
      }
      if (local_2c < b0->slen) {
        b0_local._4_4_ = 1;
      }
      else if (local_2c < b1->slen) {
        b0_local._4_4_ = -1;
      }
      else {
        b0_local._4_4_ = 0;
      }
    }
  }
  return b0_local._4_4_;
}

Assistant:

int bstrcmp (const_bstring b0, const_bstring b1) {
int i, v, n;

	if (b0 == NULL || b1 == NULL || b0->data == NULL || b1->data == NULL ||
		b0->slen < 0 || b1->slen < 0) return SHRT_MIN;
	n = b0->slen; if (n > b1->slen) n = b1->slen;
	if (b0->slen == b1->slen && (b0->data == b1->data || b0->slen == 0))
		return BSTR_OK;

	for (i = 0; i < n; i ++) {
		v = ((char) b0->data[i]) - ((char) b1->data[i]);
		if (v != 0) return v;
		if (b0->data[i] == (unsigned char) '\0') return BSTR_OK;
	}

	if (b0->slen > n) return 1;
	if (b1->slen > n) return -1;
	return BSTR_OK;
}